

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O1

FT_ULong ft_gzip_file_io(FT_GZipFile zip,FT_ULong pos,FT_Byte *buffer,FT_ULong count)

{
  FT_ULong *pFVar1;
  FT_Error error;
  FT_Error FVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  FT_ULong FVar6;
  bool bVar7;
  
  pFVar1 = &zip->pos;
  if (pos < zip->pos) {
    FVar2 = FT_Stream_Seek(zip->source,zip->start);
    if (FVar2 != 0) {
      return 0;
    }
    inflateReset(&zip->zstream);
    (zip->zstream).avail_in = 0;
    (zip->zstream).next_in = zip->input;
    (zip->zstream).avail_out = 0;
    (zip->zstream).next_out = zip->buffer;
    zip->limit = (FT_Byte *)pFVar1;
    zip->cursor = (FT_Byte *)pFVar1;
    zip->pos = 0;
  }
  uVar5 = pos - *pFVar1;
  if (pos < *pFVar1 || uVar5 == 0) {
    if (count != 0) goto LAB_0027332c;
  }
  else {
    iVar3 = 0;
    do {
      uVar4 = (long)zip->limit - (long)zip->cursor;
      if (uVar5 <= uVar4) {
        uVar4 = uVar5;
      }
      zip->cursor = zip->cursor + uVar4;
      zip->pos = zip->pos + uVar4;
      uVar5 = uVar5 - uVar4;
      if (uVar5 == 0) {
        bVar7 = false;
      }
      else {
        iVar3 = ft_gzip_file_fill_output(zip);
        bVar7 = iVar3 == 0;
      }
    } while (bVar7);
    if (count != 0 && iVar3 == 0) {
LAB_0027332c:
      FVar6 = 0;
      while( true ) {
        uVar5 = (long)zip->limit - (long)zip->cursor;
        if (count <= uVar5) {
          uVar5 = count;
        }
        memcpy(buffer,zip->cursor,uVar5);
        FVar6 = FVar6 + uVar5;
        zip->cursor = zip->cursor + uVar5;
        zip->pos = zip->pos + uVar5;
        count = count - uVar5;
        if (count == 0) break;
        buffer = buffer + uVar5;
        FVar2 = ft_gzip_file_fill_output(zip);
        if (FVar2 != 0) {
          return FVar6;
        }
      }
      return FVar6;
    }
  }
  return 0;
}

Assistant:

static FT_ULong
  ft_gzip_file_io( FT_GZipFile  zip,
                   FT_ULong     pos,
                   FT_Byte*     buffer,
                   FT_ULong     count )
  {
    FT_ULong  result = 0;
    FT_Error  error;


    /* Reset inflate stream if we're seeking backwards.        */
    /* Yes, that is not too efficient, but it saves memory :-) */
    if ( pos < zip->pos )
    {
      error = ft_gzip_file_reset( zip );
      if ( error )
        goto Exit;
    }

    /* skip unwanted bytes */
    if ( pos > zip->pos )
    {
      error = ft_gzip_file_skip_output( zip, (FT_ULong)( pos - zip->pos ) );
      if ( error )
        goto Exit;
    }

    if ( count == 0 )
      goto Exit;

    /* now read the data */
    for (;;)
    {
      FT_ULong  delta;


      delta = (FT_ULong)( zip->limit - zip->cursor );
      if ( delta >= count )
        delta = count;

      FT_MEM_COPY( buffer, zip->cursor, delta );
      buffer      += delta;
      result      += delta;
      zip->cursor += delta;
      zip->pos    += delta;

      count -= delta;
      if ( count == 0 )
        break;

      error = ft_gzip_file_fill_output( zip );
      if ( error )
        break;
    }

  Exit:
    return result;
  }